

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sequence_catalog_entry.cpp
# Opt level: O2

string * __thiscall
duckdb::SequenceCatalogEntry::ToSQL_abi_cxx11_
          (string *__return_storage_ptr__,SequenceCatalogEntry *this)

{
  ostream *poVar1;
  char *pcVar2;
  SequenceData seq_data;
  stringstream ss;
  SequenceData local_1e0;
  stringstream local_1a0 [16];
  ostream local_190 [376];
  
  GetData(&local_1e0,this);
  ::std::__cxx11::stringstream::stringstream(local_1a0);
  ::std::operator<<(local_190,"CREATE SEQUENCE ");
  ::std::operator<<(local_190,
                    (string *)
                    &(this->super_StandardEntry).super_InCatalogEntry.super_CatalogEntry.name);
  poVar1 = ::std::operator<<(local_190," INCREMENT BY ");
  ::std::ostream::_M_insert<long>((long)poVar1);
  poVar1 = ::std::operator<<(local_190," MINVALUE ");
  ::std::ostream::_M_insert<long>((long)poVar1);
  poVar1 = ::std::operator<<(local_190," MAXVALUE ");
  ::std::ostream::_M_insert<long>((long)poVar1);
  poVar1 = ::std::operator<<(local_190," START ");
  ::std::ostream::_M_insert<long>((long)poVar1);
  poVar1 = ::std::operator<<(local_190," ");
  pcVar2 = "NO CYCLE";
  if (local_1e0.cycle != false) {
    pcVar2 = "CYCLE";
  }
  poVar1 = ::std::operator<<(poVar1,pcVar2);
  ::std::operator<<(poVar1,";");
  ::std::__cxx11::stringbuf::str();
  ::std::__cxx11::stringstream::~stringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

string SequenceCatalogEntry::ToSQL() const {
	auto seq_data = GetData();

	std::stringstream ss;
	ss << "CREATE SEQUENCE ";
	ss << name;
	ss << " INCREMENT BY " << seq_data.increment;
	ss << " MINVALUE " << seq_data.min_value;
	ss << " MAXVALUE " << seq_data.max_value;
	ss << " START " << seq_data.counter;
	ss << " " << (seq_data.cycle ? "CYCLE" : "NO CYCLE") << ";";
	return ss.str();
}